

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void chunk(LexState *ls)

{
  unsigned_short *puVar1;
  FuncState *pFVar2;
  Instruction *pIVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint first;
  TString *pTVar9;
  TString *pTVar10;
  byte bVar11;
  uint uVar12;
  FuncState *pFVar13;
  expdesc e;
  expdesc b;
  int local_74;
  LHS_assign local_70;
  LHS_assign *local_50;
  anon_union_8_2_fd02c123_for_u local_48 [2];
  FuncState *local_38;
  
  uVar12 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar12;
  if (200 < (uVar12 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  do {
    iVar6 = (ls->t).token;
    if ((iVar6 - 0x104U < 0x1c) && ((0x8010007U >> (iVar6 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x13 < iVar6 - 0x102U) {
switchD_0010fd36_caseD_104:
      pFVar2 = ls->fs;
      primaryexp(ls,&local_70.v);
      if (local_70.v.k == VCALL) {
        pIVar3 = pFVar2->f->code;
        pIVar3[local_70.v.u.s.info] = pIVar3[local_70.v.u.s.info] & 0xff803fff | 0x4000;
      }
      else {
        local_70.prev = (LHS_assign *)0x0;
        assignment(ls,&local_70,1);
      }
      goto LAB_00110521;
    }
    iVar5 = ls->linenumber;
    switch(iVar6) {
    case 0x102:
      luaX_next(ls);
      breakstat(ls);
      goto LAB_001105ea;
    case 0x103:
      luaX_next(ls);
      block(ls);
      check_match(ls,0x106,0x103,iVar5);
      break;
    default:
      goto switchD_0010fd36_caseD_104;
    case 0x108:
      pFVar2 = ls->fs;
      local_48[0].s.info = -1;
      local_48[0]._4_1_ = pFVar2->nactvar;
      local_48[0]._5_1_ = '\0';
      local_48[0]._6_1_ = '\x01';
      local_50 = (LHS_assign *)pFVar2->bl;
      pFVar2->bl = (BlockCnt *)&local_50;
      luaX_next(ls);
      pTVar10 = str_checkname(ls);
      iVar6 = (ls->t).token;
      if ((iVar6 == 0x2c) || (iVar6 == 0x10b)) {
        local_38 = ls->fs;
        local_74 = local_38->freereg;
        pTVar9 = luaX_newstring(ls,"(for generator)",0xf);
        new_localvar(ls,pTVar9,0);
        pTVar9 = luaX_newstring(ls,"(for state)",0xb);
        iVar6 = 1;
        new_localvar(ls,pTVar9,1);
        pTVar9 = luaX_newstring(ls,"(for control)",0xd);
        new_localvar(ls,pTVar9,2);
        new_localvar(ls,pTVar10,3);
        if ((ls->t).token == 0x2c) {
          iVar7 = 4;
          do {
            iVar6 = iVar7;
            luaX_next(ls);
            pTVar10 = str_checkname(ls);
            new_localvar(ls,pTVar10,iVar6);
            iVar7 = iVar6 + 1;
          } while ((ls->t).token == 0x2c);
          iVar6 = iVar6 + -2;
        }
        checknext(ls,0x10b);
        iVar7 = ls->linenumber;
        iVar8 = explist1(ls,(expdesc *)&local_70);
        adjust_assign(ls,3,iVar8,(expdesc *)&local_70);
        luaK_checkstack(local_38,3);
        iVar8 = 0;
LAB_001105a3:
        forbody(ls,local_74,iVar7,iVar6,iVar8);
      }
      else {
        if (iVar6 == 0x3d) {
          pFVar13 = ls->fs;
          local_74 = pFVar13->freereg;
          pTVar9 = luaX_newstring(ls,"(for index)",0xb);
          new_localvar(ls,pTVar9,0);
          pTVar9 = luaX_newstring(ls,"(for limit)",0xb);
          new_localvar(ls,pTVar9,1);
          pTVar9 = luaX_newstring(ls,"(for step)",10);
          new_localvar(ls,pTVar9,2);
          new_localvar(ls,pTVar10,3);
          checknext(ls,0x3d);
          subexpr(ls,(expdesc *)&local_70,0);
          luaK_exp2nextreg(ls->fs,(expdesc *)&local_70);
          checknext(ls,0x2c);
          subexpr(ls,(expdesc *)&local_70,0);
          luaK_exp2nextreg(ls->fs,(expdesc *)&local_70);
          if ((ls->t).token == 0x2c) {
            luaX_next(ls);
            subexpr(ls,(expdesc *)&local_70,0);
            luaK_exp2nextreg(ls->fs,(expdesc *)&local_70);
          }
          else {
            iVar6 = pFVar13->freereg;
            uVar12 = luaK_numberK(pFVar13,1.0);
            luaK_codeABx(pFVar13,OP_LOADK,iVar6,uVar12);
            luaK_reserveregs(pFVar13,1);
          }
          iVar6 = 1;
          iVar8 = 1;
          iVar7 = iVar5;
          goto LAB_001105a3;
        }
        luaX_syntaxerror(ls,"\'=\' or \'in\' expected");
      }
      check_match(ls,0x106,0x108,iVar5);
      leaveblock(pFVar2);
      bVar4 = true;
      goto LAB_001105ec;
    case 0x109:
      luaX_next(ls);
      singlevar(ls,(expdesc *)&local_70);
      while (iVar6 = (ls->t).token, iVar6 == 0x2e) {
        field(ls,(expdesc *)&local_70);
      }
      if (iVar6 == 0x3a) {
        field(ls,(expdesc *)&local_70);
      }
      body(ls,(expdesc *)&local_50,(uint)(iVar6 == 0x3a),iVar5);
      luaK_storevar(ls->fs,(expdesc *)&local_70,(expdesc *)&local_50);
      luaK_fixline(ls->fs,iVar5);
      break;
    case 0x10a:
      pFVar2 = ls->fs;
      local_70.prev = (LHS_assign *)CONCAT44(local_70.prev._4_4_,0xffffffff);
      while( true ) {
        iVar7 = test_then_block(ls);
        iVar6 = (ls->t).token;
        if (iVar6 != 0x105) break;
        iVar6 = luaK_jump(pFVar2);
        luaK_concat(pFVar2,(int *)&local_70,iVar6);
        luaK_patchtohere(pFVar2,iVar7);
      }
      if (iVar6 == 0x104) {
        iVar6 = luaK_jump(pFVar2);
        luaK_concat(pFVar2,(int *)&local_70,iVar6);
        luaK_patchtohere(pFVar2,iVar7);
        luaX_next(ls);
        block(ls);
      }
      else {
        luaK_concat(pFVar2,(int *)&local_70,iVar7);
      }
      luaK_patchtohere(pFVar2,(int)local_70.prev);
      check_match(ls,0x106,0x10a,iVar5);
      goto LAB_001104f2;
    case 0x10c:
      luaX_next(ls);
      if ((ls->t).token == 0x109) {
        luaX_next(ls);
        pFVar2 = ls->fs;
        pTVar10 = str_checkname(ls);
        new_localvar(ls,pTVar10,0);
        local_70.v.k = pFVar2->freereg;
        local_70.v.u.nval = -NAN;
        local_70.prev = (LHS_assign *)CONCAT44(local_70.prev._4_4_,6);
        luaK_reserveregs(pFVar2,1);
        pFVar13 = ls->fs;
        bVar11 = pFVar13->nactvar + 1;
        pFVar13->nactvar = bVar11;
        pFVar13->f->locvars[*(ushort *)&pFVar13->upvalues[(ulong)bVar11 + 0x3b].info].startpc =
             pFVar13->pc;
        body(ls,(expdesc *)&local_50,0,ls->linenumber);
        luaK_storevar(pFVar2,(expdesc *)&local_70,(expdesc *)&local_50);
        pFVar2->f->locvars[*(ushort *)&pFVar2->upvalues[(ulong)pFVar2->nactvar + 0x3b].info].startpc
             = pFVar2->pc;
      }
      else {
        pTVar10 = str_checkname(ls);
        new_localvar(ls,pTVar10,0);
        iVar6 = 1;
        if ((ls->t).token == 0x2c) {
          iVar5 = 1;
          do {
            luaX_next(ls);
            pTVar10 = str_checkname(ls);
            iVar6 = iVar5 + 1;
            new_localvar(ls,pTVar10,iVar5);
            iVar5 = iVar6;
          } while ((ls->t).token == 0x2c);
        }
        if ((ls->t).token == 0x3d) {
          luaX_next(ls);
          iVar5 = explist1(ls,(expdesc *)&local_70);
        }
        else {
          local_70.prev = (LHS_assign *)((ulong)local_70.prev & 0xffffffff00000000);
          iVar5 = 0;
        }
        adjust_assign(ls,iVar6,iVar5,(expdesc *)&local_70);
        adjustlocalvars(ls,iVar6);
      }
      break;
    case 0x110:
      pFVar2 = ls->fs;
      iVar6 = luaK_getlabel(pFVar2);
      local_70.v.k = ~VVOID;
      local_70.v._6_1_ = 1;
      local_70.v._4_1_ = pFVar2->nactvar;
      local_70.v._5_1_ = 0;
      local_70.prev = (LHS_assign *)pFVar2->bl;
      pFVar2->bl = (BlockCnt *)&local_70;
      local_48[0].s.info = -1;
      local_48[0]._5_1_ = '\0';
      local_48[0]._6_1_ = '\0';
      pFVar2->bl = (BlockCnt *)&local_50;
      local_50 = &local_70;
      local_48[0]._4_1_ = local_70.v._4_1_;
      luaX_next(ls);
      chunk(ls);
      check_match(ls,0x114,0x110,iVar5);
      iVar5 = cond(ls);
      if (local_48[0].s.aux._1_1_ == '\0') {
        leaveblock(pFVar2);
        pFVar13 = ls->fs;
      }
      else {
        breakstat(ls);
        luaK_patchtohere(ls->fs,iVar5);
        leaveblock(pFVar2);
        pFVar13 = ls->fs;
        iVar5 = luaK_jump(pFVar2);
      }
      luaK_patchlist(pFVar13,iVar5,iVar6);
      leaveblock(pFVar2);
LAB_001104f2:
      bVar4 = true;
      goto LAB_001105ec;
    case 0x111:
      pFVar2 = ls->fs;
      luaX_next(ls);
      iVar6 = (ls->t).token;
      uVar12 = iVar6 - 0x104;
      first = 0;
      if (iVar6 == 0x3b) {
        iVar6 = 0;
      }
      else {
        iVar6 = 0;
        first = 0;
        if ((uVar12 < 0x1c & (byte)(0x8010007 >> ((byte)uVar12 & 0x1f))) == 0) {
          iVar6 = explist1(ls,(expdesc *)&local_70);
          if ((int)local_70.prev - 0xdU < 2) {
            luaK_setreturns(pFVar2,(expdesc *)&local_70,-1);
            if ((iVar6 == 1) && ((int)local_70.prev == 0xd)) {
              pIVar3 = pFVar2->f->code;
              pIVar3[(int)local_70.v.k] = pIVar3[(int)local_70.v.k] & 0xffffffc0 | 0x1d;
            }
            first = (uint)pFVar2->nactvar;
            iVar6 = -1;
          }
          else if (iVar6 == 1) {
            first = luaK_exp2anyreg(pFVar2,(expdesc *)&local_70);
            iVar6 = 1;
          }
          else {
            luaK_exp2nextreg(pFVar2,(expdesc *)&local_70);
            first = (uint)pFVar2->nactvar;
          }
        }
      }
      luaK_ret(pFVar2,first,iVar6);
LAB_001105ea:
      bVar4 = false;
      goto LAB_001105ec;
    case 0x115:
      pFVar2 = ls->fs;
      luaX_next(ls);
      iVar6 = luaK_getlabel(pFVar2);
      iVar7 = cond(ls);
      local_70.v.k = ~VVOID;
      local_70.v._6_1_ = 1;
      local_70.v._4_1_ = pFVar2->nactvar;
      local_70.v._5_1_ = 0;
      local_70.prev = (LHS_assign *)pFVar2->bl;
      pFVar2->bl = (BlockCnt *)&local_70;
      checknext(ls,0x103);
      block(ls);
      iVar8 = luaK_jump(pFVar2);
      luaK_patchlist(pFVar2,iVar8,iVar6);
      check_match(ls,0x106,0x115,iVar5);
      leaveblock(pFVar2);
      luaK_patchtohere(pFVar2,iVar7);
    }
LAB_00110521:
    bVar4 = true;
LAB_001105ec:
    if ((ls->t).token == 0x3b) {
      luaX_next(ls);
    }
    ls->fs->freereg = (uint)ls->fs->nactvar;
  } while (bVar4);
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

static void chunk (LexState *ls) {
  /* chunk -> { stat [`;'] } */
  int islast = 0;
  enterlevel(ls);
  while (!islast && !block_follow(ls->t.token)) {
    islast = statement(ls);
    testnext(ls, ';');
    lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
               ls->fs->freereg >= ls->fs->nactvar);
    ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  }
  leavelevel(ls);
}